

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pardiso_interface.c
# Opt level: O2

c_int init_linsys_solver_pardiso
                (pardiso_solver **sp,csc *P,csc *A,c_float sigma,c_float *rho_vec,c_int polish)

{
  size_t __size;
  uint uVar1;
  pardiso_solver *s;
  c_float *pcVar2;
  long lVar3;
  c_int *pcVar4;
  csc *pcVar5;
  c_int *pcVar6;
  long lVar7;
  c_int cVar8;
  char *__format;
  long lVar9;
  c_int **Pdiag_idx;
  c_int *Pdiag_n;
  c_int *pcVar10;
  
  s = (pardiso_solver *)calloc(1,0x4f8);
  *sp = s;
  lVar3 = P->n;
  s->n = lVar3;
  lVar9 = A->m;
  s->m = lVar9;
  lVar7 = lVar9 + lVar3;
  s->nKKT = lVar7;
  s->sigma = sigma;
  s->polish = polish;
  s->solve = solve_linsys_pardiso;
  s->free = free_linsys_solver_pardiso;
  s->update_matrices = update_linsys_solver_matrices_pardiso;
  s->update_rho_vec = update_linsys_solver_rho_vec_pardiso;
  s->type = MKL_PARDISO_SOLVER;
  __size = lVar7 * 8;
  pcVar2 = (c_float *)malloc(__size);
  s->bp = pcVar2;
  pcVar2 = (c_float *)malloc(__size);
  s->sol = pcVar2;
  pcVar2 = (c_float *)malloc(__size);
  s->rho_inv_vec = pcVar2;
  if (polish == 0) {
    pcVar4 = (c_int *)malloc(P->p[lVar3] << 3);
    s->PtoKKT = pcVar4;
    pcVar6 = (c_int *)malloc(A->p[A->n] << 3);
    s->AtoKKT = pcVar6;
    pcVar10 = (c_int *)malloc(lVar9 * 8);
    s->rhotoKKT = pcVar10;
    lVar3 = 0;
    if (lVar9 < 1) {
      lVar9 = lVar3;
    }
    for (; lVar9 != lVar3; lVar3 = lVar3 + 1) {
      pcVar2[lVar3] = 1.0 / rho_vec[lVar3];
    }
    Pdiag_idx = &s->Pdiag_idx;
    Pdiag_n = &s->Pdiag_n;
  }
  else {
    lVar3 = 0;
    if (lVar9 < 1) {
      lVar9 = lVar3;
    }
    for (; lVar9 != lVar3; lVar3 = lVar3 + 1) {
      pcVar2[lVar3] = sigma;
    }
    Pdiag_idx = (c_int **)0x0;
    Pdiag_n = (c_int *)0x0;
    pcVar10 = (c_int *)0x0;
    pcVar4 = (c_int *)0x0;
    pcVar6 = (c_int *)0x0;
  }
  pcVar5 = form_KKT(P,A,1,sigma,pcVar2,pcVar4,pcVar6,Pdiag_idx,Pdiag_n,pcVar10);
  s->KKT = pcVar5;
  if (pcVar5 == (csc *)0x0) {
    printf("ERROR in %s: ","init_linsys_solver_pardiso");
    printf("Error in forming KKT matrix");
    putchar(10);
    free_linsys_solver_pardiso(s);
  }
  else {
    lVar3 = pcVar5->m;
    pcVar4 = pcVar5->p;
    lVar9 = pcVar4[lVar3];
    pcVar6 = (c_int *)malloc(lVar9 * 8);
    s->KKT_i = pcVar6;
    pcVar10 = (c_int *)malloc(lVar3 * 8 + 8);
    s->KKT_p = pcVar10;
    lVar3 = 0;
    if (lVar9 < 1) {
      lVar9 = lVar3;
    }
    for (; lVar9 != lVar3; lVar3 = lVar3 + 1) {
      pcVar6[lVar3] = pcVar5->i[lVar3] + 1;
    }
    for (lVar3 = 0; lVar3 <= lVar7; lVar3 = lVar3 + 1) {
      pcVar10[lVar3] = pcVar4[lVar3] + 1;
    }
    mkl_set_interface_layer(1);
    s->mtype = -2;
    s->nrhs = 1;
    s->maxfct = 1;
    s->mnum = 1;
    s->error = 0;
    s->msglvl = 0;
    for (lVar7 = 0x10; lVar7 != 0x50; lVar7 = lVar7 + 1) {
      s->iparm[lVar7 + -0x10] = 0;
      s->pt[lVar7 + -0x10] = (void *)0x0;
    }
    s->iparm[0] = 1;
    s->iparm[1] = 3;
    s->iparm[5] = (ulong)(polish != 0);
    s->iparm[7] = 0;
    s->iparm[9] = 0xd;
    s->iparm[0x22] = 0;
    cVar8 = mkl_get_max_threads();
    s->nthreads = cVar8;
    s->phase = 0xb;
    pcVar2 = &s->fdum;
    pardiso(s->pt,&s->maxfct,&s->mnum,&s->mtype,&s->phase,&s->nKKT,s->KKT->x,s->KKT_p,s->KKT_i,
            &s->idum,&s->nrhs,s->iparm,&s->msglvl,pcVar2,pcVar2,&s->error);
    if (s->error == 0) {
      s->phase = 0x16;
      pardiso(s->pt,&s->maxfct,&s->mnum,&s->mtype,&s->phase,&s->nKKT,s->KKT->x,s->KKT_p,s->KKT_i,
              &s->idum,&s->nrhs,s->iparm,&s->msglvl,pcVar2,pcVar2,&s->error);
      if (s->error == 0) {
        return 0;
      }
      printf("ERROR in %s: ","init_linsys_solver_pardiso");
      uVar1 = (uint)s->error;
      __format = "Error during numerical factorization: %d";
    }
    else {
      printf("ERROR in %s: ","init_linsys_solver_pardiso");
      uVar1 = (uint)s->error;
      __format = "Error during symbolic factorization: %d";
    }
    printf(__format,(ulong)uVar1);
    putchar(10);
    free_linsys_solver_pardiso(s);
    *sp = (pardiso_solver *)0x0;
  }
  return 4;
}

Assistant:

c_int init_linsys_solver_pardiso(pardiso_solver ** sp, const csc * P, const csc * A, c_float sigma, const c_float * rho_vec, c_int polish){
    c_int i;                     // loop counter
    c_int nnzKKT;                // Number of nonzeros in KKT
    // Define Variables
    c_int n_plus_m;              // n_plus_m dimension


    // Allocate private structure to store KKT factorization
    pardiso_solver *s;
    s = c_calloc(1, sizeof(pardiso_solver));
    *sp = s;

    // Size of KKT
    s->n = P->n;
    s->m = A->m;
    n_plus_m = s->n + s->m;
    s->nKKT = n_plus_m;

    // Sigma parameter
    s->sigma = sigma;

    // Polishing flag
    s->polish = polish;

    // Link Functions
    s->solve = &solve_linsys_pardiso;
    s->free = &free_linsys_solver_pardiso;
    s->update_matrices = &update_linsys_solver_matrices_pardiso;
    s->update_rho_vec = &update_linsys_solver_rho_vec_pardiso;

    // Assign type
    s->type = MKL_PARDISO_SOLVER;

    // Working vector
    s->bp = (c_float *)c_malloc(sizeof(c_float) * n_plus_m);

    // Solution vector
    s->sol  = (c_float *)c_malloc(sizeof(c_float) * n_plus_m);

    // Parameter vector
    s->rho_inv_vec = (c_float *)c_malloc(sizeof(c_float) * n_plus_m);

    // Form KKT matrix
    if (polish){ // Called from polish()
        // Use s->rho_inv_vec for storing param2 = vec(delta)
        for (i = 0; i < A->m; i++){
            s->rho_inv_vec[i] = sigma;
        }

        s->KKT = form_KKT(P, A, 1, sigma, s->rho_inv_vec, OSQP_NULL, OSQP_NULL, OSQP_NULL, OSQP_NULL, OSQP_NULL);
    }
    else { // Called from ADMM algorithm

        // Allocate vectors of indices
        s->PtoKKT = c_malloc((P->p[P->n]) * sizeof(c_int));
        s->AtoKKT = c_malloc((A->p[A->n]) * sizeof(c_int));
        s->rhotoKKT = c_malloc((A->m) * sizeof(c_int));

        // Use s->rho_inv_vec for storing param2 = rho_inv_vec
        for (i = 0; i < A->m; i++){
            s->rho_inv_vec[i] = 1. / rho_vec[i];
        }

        s->KKT = form_KKT(P, A, 1, sigma, s->rho_inv_vec,
                             s->PtoKKT, s->AtoKKT,
                             &(s->Pdiag_idx), &(s->Pdiag_n), s->rhotoKKT);
    }

    // Check if matrix has been created
    if (!(s->KKT)) {
#ifdef PRINTING
	    c_eprint("Error in forming KKT matrix");
#endif
        free_linsys_solver_pardiso(s);
        return OSQP_LINSYS_SOLVER_INIT_ERROR;
    } else {
	    // Adjust indexing for Pardiso
	    nnzKKT = s->KKT->p[s->KKT->m];
	    s->KKT_i = c_malloc((nnzKKT) * sizeof(c_int));
	    s->KKT_p = c_malloc((s->KKT->m + 1) * sizeof(c_int));

	    for(i = 0; i < nnzKKT; i++){
	    	s->KKT_i[i] = s->KKT->i[i] + 1;
	    }
	    for(i = 0; i < n_plus_m+1; i++){
	    	s->KKT_p[i] = s->KKT->p[i] + 1;
	    }

    }

    // Set MKL interface layer (Long integers if activated)
#ifdef DLONG
    mkl_set_interface_layer(MKL_INTERFACE_ILP64);
#else
    mkl_set_interface_layer(MKL_INTERFACE_LP64);
#endif

    // Set Pardiso variables
    s->mtype = -2;        // Real symmetric indefinite matrix
    s->nrhs = 1;          // Number of right hand sides
    s->maxfct = 1;        // Maximum number of numerical factorizations
    s->mnum = 1;          // Which factorization to use
    s->msglvl = 0;        // Do not print statistical information
    s->error = 0;         // Initialize error flag
    for ( i = 0; i < 64; i++ ) {
        s->iparm[i] = 0;  // Setup Pardiso control parameters
        s->pt[i] = 0;     // Initialize the internal solver memory pointer
    }
    s->iparm[0] = 1;      // No solver default
    s->iparm[1] = 3;      // Fill-in reordering from OpenMP
    if (polish) {
        s->iparm[5] = 1;  // Write solution into b
    } else {
        s->iparm[5] = 0;  // Do NOT write solution into b
    }
    /* s->iparm[7] = 2;      // Max number of iterative refinement steps */
    s->iparm[7] = 0;      // Number of iterative refinement steps (auto, performs them only if perturbed pivots are obtained)
    s->iparm[9] = 13;     // Perturb the pivot elements with 1E-13
    s->iparm[34] = 0;     // Use Fortran-style indexing for indices
    /* s->iparm[34] = 1;     // Use C-style indexing for indices */

    // Print number of threads
    s->nthreads = mkl_get_max_threads();

    // Reordering and symbolic factorization
    s->phase = PARDISO_SYMBOLIC;
    pardiso (s->pt, &(s->maxfct), &(s->mnum), &(s->mtype), &(s->phase),
             &(s->nKKT), s->KKT->x, s->KKT_p, s->KKT_i, &(s->idum), &(s->nrhs),
             s->iparm, &(s->msglvl), &(s->fdum), &(s->fdum), &(s->error));
    if ( s->error != 0 ){
#ifdef PRINTING
        c_eprint("Error during symbolic factorization: %d", (int)s->error);
#endif
        free_linsys_solver_pardiso(s);
        *sp = OSQP_NULL;
        return OSQP_LINSYS_SOLVER_INIT_ERROR;
    }

    // Numerical factorization
    s->phase = PARDISO_NUMERIC;
    pardiso (s->pt, &(s->maxfct), &(s->mnum), &(s->mtype), &(s->phase),
             &(s->nKKT), s->KKT->x, s->KKT_p, s->KKT_i, &(s->idum), &(s->nrhs),
             s->iparm, &(s->msglvl), &(s->fdum), &(s->fdum), &(s->error));
    if ( s->error ){
#ifdef PRINTING
        c_eprint("Error during numerical factorization: %d", (int)s->error);
#endif
        free_linsys_solver_pardiso(s);
        *sp = OSQP_NULL;
        return OSQP_LINSYS_SOLVER_INIT_ERROR;
    }


    // No error
    return 0;
}